

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O0

genxStatus genxStartElement(genxElement e)

{
  writerSequence wVar1;
  genxStatus gVar2;
  genxElement in_RDI;
  int i;
  genxWriter w;
  plist *in_stack_ffffffffffffffd8;
  int local_1c;
  genxWriter w_00;
  genxStatus local_4;
  
  w_00 = in_RDI->writer;
  wVar1 = w_00->sequence;
  if (wVar1 == SEQUENCE_NO_DOC) {
LAB_00282507:
    w_00->status = GENX_SEQUENCE_ERROR;
    local_4 = GENX_SEQUENCE_ERROR;
  }
  else {
    if (wVar1 != SEQUENCE_PRE_DOC) {
      if (wVar1 == SEQUENCE_POST_DOC) goto LAB_00282507;
      if (wVar1 - SEQUENCE_START_TAG < 2) {
        gVar2 = writeStartTag(w_00);
        w_00->status = gVar2;
        if (gVar2 != GENX_SUCCESS) {
          return w_00->status;
        }
      }
    }
    w_00->sequence = SEQUENCE_START_TAG;
    for (local_1c = 0; local_1c < (w_00->attributes).count; local_1c = local_1c + 1) {
      *(undefined4 *)((long)(w_00->attributes).pointers[local_1c] + 0x28) = 0;
    }
    gVar2 = listAppend(in_stack_ffffffffffffffd8,(void *)0x2825b0);
    w_00->status = gVar2;
    if (gVar2 == GENX_SUCCESS) {
      gVar2 = listAppend(in_stack_ffffffffffffffd8,(void *)0x2825e0);
      w_00->status = gVar2;
      if (gVar2 == GENX_SUCCESS) {
        w_00->nowStarting = in_RDI;
        local_4 = GENX_SUCCESS;
      }
      else {
        local_4 = w_00->status;
      }
    }
    else {
      local_4 = w_00->status;
    }
  }
  return local_4;
}

Assistant:

genxStatus genxStartElement(genxElement e)
{
  genxWriter w = e->writer;
  int i;

  switch (w->sequence)
  {
  case SEQUENCE_NO_DOC:
  case SEQUENCE_POST_DOC:
    return w->status = GENX_SEQUENCE_ERROR;
  case SEQUENCE_START_TAG:
  case SEQUENCE_ATTRIBUTES:
    if ((w->status = writeStartTag(w)) != GENX_SUCCESS)
      return w->status;
    break;
  case SEQUENCE_PRE_DOC:
  case SEQUENCE_CONTENT:
    break;
  }

  w->sequence = SEQUENCE_START_TAG;

  /* clear provided attributes */
  for (i = 0; i < w->attributes.count; i++)
    ((genxAttribute) w->attributes.pointers[i])->provided = 0;

  /*
   * push the stack.  We push a NULL after a pointer to this element
   *  because the stack will also contain pointers to the namespace
   *  attributes that got declared here, so we can keep track of what's
   *  in effect.  I.e. a single stack entry consists logically of a pointer
   *  to an element object, a NULL, then zero or more pairs of pointers to
   *  namespace objects/declarations
   */
  if ((w->status = listAppend(&w->stack, e)) != GENX_SUCCESS)
    return w->status;
  if ((w->status = listAppend(&w->stack, NULL)) != GENX_SUCCESS)
    return w->status;

  w->nowStarting = e;

  return GENX_SUCCESS;
}